

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error
ft_stroke_border_lineto(PVG_FT_StrokeBorder border,PVG_FT_Vector *to,PVG_FT_Bool movable)

{
  PVG_FT_UInt PVar1;
  PVG_FT_Byte *pPVar2;
  PVG_FT_Pos PVar3;
  uint uVar4;
  PVG_FT_Vector *pPVar5;
  
  if (border->start < 0) {
    __assert_fail("border->start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-ft-stroker.c"
                  ,0x148,
                  "PVG_FT_Error ft_stroke_border_lineto(PVG_FT_StrokeBorder, PVG_FT_Vector *, PVG_FT_Bool)"
                 );
  }
  if (border->movable == '\0') {
    if ((uint)border->start < border->num_points) {
      uVar4 = border->num_points - 1;
      if (((border->points[uVar4].x - to->x) + 1U < 3) &&
         (pPVar5 = (PVG_FT_Vector *)((border->points[uVar4].y - to->y) + 1),
         pPVar5 < (PVG_FT_Vector *)0x3)) goto LAB_0011d276;
    }
    ft_stroke_border_grow(border,1);
    pPVar5 = border->points;
    uVar4 = border->num_points;
    pPVar2 = border->tags;
    PVar3 = to->y;
    pPVar5[uVar4].x = to->x;
    pPVar5[uVar4].y = PVar3;
    pPVar2[uVar4] = '\x01';
    border->num_points = border->num_points + 1;
  }
  else {
    pPVar5 = border->points;
    PVar1 = border->num_points;
    PVar3 = to->y;
    pPVar5[PVar1 - 1].x = to->x;
    pPVar5[PVar1 - 1].y = PVar3;
  }
  border->movable = movable;
LAB_0011d276:
  return (PVG_FT_Error)pPVar5;
}

Assistant:

static PVG_FT_Error ft_stroke_border_lineto(PVG_FT_StrokeBorder border,
                                           PVG_FT_Vector* to, PVG_FT_Bool movable)
{
    PVG_FT_Error error = 0;

    assert(border->start >= 0);

    if (border->movable) {
        /* move last point */
        border->points[border->num_points - 1] = *to;
    } else {
        /* don't add zero-length lineto, but always add moveto */
        if (border->num_points > border->start &&
            PVG_FT_IS_SMALL(border->points[border->num_points - 1].x - to->x) &&
            PVG_FT_IS_SMALL(border->points[border->num_points - 1].y - to->y))
            return error;

        /* add one point */
        error = ft_stroke_border_grow(border, 1);
        if (!error) {
            PVG_FT_Vector* vec = border->points + border->num_points;
            PVG_FT_Byte*   tag = border->tags + border->num_points;

            vec[0] = *to;
            tag[0] = PVG_FT_STROKE_TAG_ON;

            border->num_points += 1;
        }
    }
    border->movable = movable;
    return error;
}